

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O0

void __thiscall
clipp::parameter::add_flags<std::__cxx11::string,char_const(&)[10]>
          (parameter *this,memento *s1,char (*s2) [10])

{
  char *in_RDX;
  string *in_RSI;
  parameter *in_RDI;
  arg_string *in_stack_ffffffffffffff78;
  allocator *str;
  allocator local_69;
  size_type in_stack_ffffffffffffff98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffa0;
  string local_38 [32];
  char *local_18;
  string *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::__cxx11::string::string(local_38,local_10);
  add_flags(in_RDI,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_38);
  str = &local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff98,local_18,str);
  add_flags(in_RDI,(arg_string *)str);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  return;
}

Assistant:

void
    add_flags(String1&& s1, String2&& s2, Strings&&... ss) {
        flags_.reserve(2 + sizeof...(ss));
        add_flags(std::forward<String1>(s1));
        add_flags(std::forward<String2>(s2), std::forward<Strings>(ss)...);
    }